

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

void __thiscall ProgramResult::getFromExecution(ProgramResult *this,string *command)

{
  string *psVar1;
  bool bVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  FILE *__stream;
  char *pcVar7;
  long lVar8;
  long *plVar9;
  size_t sVar10;
  size_type *psVar11;
  char cVar12;
  char *local_538;
  char buffer [1024];
  long *local_130;
  long local_128;
  long local_120 [2];
  size_type *local_110;
  Timer timer;
  string __str_1;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  ProgramResult *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  size_type *local_50;
  string __str;
  
  local_130 = local_120;
  local_78 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  local_110 = &timer.name._M_string_length;
  __str_1.field_2._8_8_ = local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_130,local_128 + (long)local_130);
  timer.name.field_2._8_8_ = 0;
  timer.startTime.__d.__r = (duration)0;
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  timer.name.field_2._8_8_ = std::chrono::_V2::steady_clock::now();
  sVar3 = timeout;
  cVar12 = '\x01';
  if (9 < timeout) {
    sVar10 = timeout;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00116a59;
      }
      if (sVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00116a59;
      }
      if (sVar10 < 10000) goto LAB_00116a59;
      bVar2 = 99999 < sVar10;
      sVar10 = sVar10 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_00116a59:
  local_50 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_50,(uint)__str._M_dataplus._M_p,sVar3);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x12d844);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_60 = *plVar9;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar9;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_88 = *plVar9;
    lStack_80 = plVar6[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar9;
    local_98 = (long *)*plVar6;
  }
  local_90 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,(ulong)(command->_M_dataplus)._M_p);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_a8 = *plVar9;
    lStack_a0 = plVar6[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar9;
    local_b8 = (long *)*plVar6;
  }
  local_b0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    buffer._8_8_ = *plVar9;
    buffer._16_8_ = plVar6[3];
    local_538 = buffer + 8;
  }
  else {
    buffer._8_8_ = *plVar9;
    local_538 = (char *)*plVar6;
  }
  buffer._0_8_ = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  iVar5 = system(local_538);
  local_78->code = iVar5;
  if (local_538 != buffer + 8) {
    operator_delete(local_538,buffer._8_8_ + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50,__str._M_string_length + 1);
  }
  sVar3 = timeout;
  cVar12 = '\x01';
  if (9 < timeout) {
    sVar10 = timeout;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00116ce3;
      }
      if (sVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00116ce3;
      }
      if (sVar10 < 10000) goto LAB_00116ce3;
      bVar2 = 99999 < sVar10;
      sVar10 = sVar10 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_00116ce3:
  timer.total = (double)&__str_1._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&timer.total,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)timer.total,(uint)__str_1._M_dataplus._M_p,sVar3);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&timer.total,0,(char *)0x0,0x12d844);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    __str._M_string_length = *psVar11;
    __str.field_2._M_allocated_capacity = plVar6[3];
    local_50 = &__str._M_string_length;
  }
  else {
    __str._M_string_length = *psVar11;
    local_50 = (size_type *)*plVar6;
  }
  __str._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_60 = *plVar9;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar9;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(command->_M_dataplus)._M_p);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_88 = *plVar9;
    lStack_80 = plVar6[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar9;
    local_98 = (long *)*plVar6;
  }
  local_90 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_a8 = *plVar9;
    lStack_a0 = plVar6[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar9;
    local_b8 = (long *)*plVar6;
  }
  local_b0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  __stream = popen((char *)local_b8,"r");
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50,__str._M_string_length + 1);
  }
  if ((size_type *)timer.total != &__str_1._M_string_length) {
    operator_delete((void *)timer.total,__str_1._M_string_length + 1);
  }
  psVar1 = &local_78->output;
  while( true ) {
    pcVar7 = fgets((char *)&local_538,0x400,__stream);
    if (pcVar7 == (char *)0x0) break;
    std::__cxx11::string::append((char *)psVar1);
  }
  pclose(__stream);
  lVar8 = std::chrono::_V2::steady_clock::now();
  timer.startTime.__d.__r =
       (duration)
       ((double)(lVar8 - timer.name.field_2._8_8_) / 1000000000.0 + (double)timer.startTime.__d.__r)
  ;
  local_78->time = (double)timer.startTime.__d.__r * 0.5;
  if (local_110 != &timer.name._M_string_length) {
    operator_delete(local_110,timer.name._M_string_length + 1);
  }
  return;
}

Assistant:

void getFromExecution(std::string command) {
    Timer timer;
    timer.start();
    // do this using just core stdio.h and stdlib.h, for portability
    // sadly this requires two invokes
    code = system(("timeout " + std::to_string(timeout) + "s " + command +
                   " > /dev/null 2> /dev/null")
                    .c_str());
    const int MAX_BUFFER = 1024;
    char buffer[MAX_BUFFER];
    FILE* stream = popen(
      ("timeout " + std::to_string(timeout) + "s " + command + " 2> /dev/null")
        .c_str(),
      "r");
    while (fgets(buffer, MAX_BUFFER, stream) != NULL) {
      output.append(buffer);
    }
    pclose(stream);
    timer.stop();
    time = timer.getTotal() / 2;
  }